

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::InternalReserveSmallCapacityFromEmpty
          (ExtensionSet *this,size_t minimum_new_capacity)

{
  type_conflict6 tVar1;
  KeyValue *pKVar2;
  char *failure_msg;
  int line;
  LogMessageFatal LStack_18;
  
  if (this->flat_capacity_ == 0) {
    if (minimum_new_capacity < 0x101) {
      if (minimum_new_capacity != 0) {
        tVar1 = absl::lts_20250127::bit_ceil<unsigned_long>(minimum_new_capacity);
        this->flat_capacity_ = (uint16_t)tVar1;
        pKVar2 = AllocateFlatMap(this->arena_,(uint16_t)tVar1);
        (this->map_).flat = pKVar2;
        return;
      }
      failure_msg = "minimum_new_capacity > 0";
      line = 0x71d;
    }
    else {
      failure_msg = "minimum_new_capacity <= kMaximumFlatCapacity";
      line = 0x71c;
    }
  }
  else {
    failure_msg = "flat_capacity_ == 0";
    line = 0x71b;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

void ExtensionSet::InternalReserveSmallCapacityFromEmpty(
    size_t minimum_new_capacity) {
  ABSL_DCHECK(flat_capacity_ == 0);
  ABSL_DCHECK(minimum_new_capacity <= kMaximumFlatCapacity);
  ABSL_DCHECK(minimum_new_capacity > 0);
  const size_t new_flat_capacity = absl::bit_ceil(minimum_new_capacity);
  flat_capacity_ = new_flat_capacity;
  map_.flat = AllocateFlatMap(arena_, new_flat_capacity);
}